

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark-loop-count.c
# Opt level: O0

int run_benchmark_loop_alive(void)

{
  int iVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  long lVar4;
  double dVar5;
  undefined1 auVar6 [16];
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  uint64_t ns;
  uv_loop_t *puStack_18;
  int ticks;
  uv_loop_t *loop;
  
  puStack_18 = uv_default_loop();
  ns._4_4_ = 0;
  uv_idle_init(puStack_18,&idle_handle);
  idle_handle.data = (void *)((long)&ns + 4);
  uv_idle_start(&idle_handle,idle_alive_cb);
  uVar2 = uv_hrtime();
  uv_run(puStack_18,UV_RUN_DEFAULT);
  uVar3 = uv_hrtime();
  lVar4 = uVar3 - uVar2;
  if ((long)ns._4_4_ != 200000000) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/benchmark-loop-count.c"
            ,0x7c,"ticks","==","(2 * 1000 * 1000 * 100)",(long)ns._4_4_,"==",200000000);
    abort();
  }
  auVar6._8_4_ = (int)((ulong)lVar4 >> 0x20);
  auVar6._0_8_ = lVar4;
  auVar6._12_4_ = 0x45300000;
  dVar5 = (auVar6._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0);
  fprintf(_stderr,"loop_alive: %d ticks in %.2fs (%.0f/s)\n",dVar5 / 1000000000.0,
          200000000.0 / (dVar5 / 1000000000.0),200000000);
  fflush(_stderr);
  close_loop(puStack_18);
  iVar1 = uv_loop_close(puStack_18);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/benchmark-loop-count.c"
            ,0x84,"0","==","uv_loop_close(loop)",0,"==",(long)iVar1);
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

BENCHMARK_IMPL(loop_alive) {
  uv_loop_t* loop = uv_default_loop();
  int ticks = 0;
  uint64_t ns;

  uv_idle_init(loop, &idle_handle);
  idle_handle.data = &ticks;
  uv_idle_start(&idle_handle, idle_alive_cb);

  ns = uv_hrtime();
  uv_run(loop, UV_RUN_DEFAULT);
  ns = uv_hrtime() - ns;

  ASSERT_EQ(ticks, NUM_TICKS2);

  fprintf(stderr, "loop_alive: %d ticks in %.2fs (%.0f/s)\n",
          NUM_TICKS2,
          ns / 1e9,
          NUM_TICKS2 / (ns / 1e9));
  fflush(stderr);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}